

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snprintf_support.c
# Opt level: O0

int snprintf_s_l(char *dest,rsize_t dmax,char *format,long a)

{
  uint uVar1;
  undefined8 in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  uint nfo;
  uint index;
  char pformatList [16];
  undefined1 local_38;
  undefined4 local_4;
  
  uVar1 = parse_format(in_RDI,in_RSI,(uint)((ulong)in_RDX >> 0x20));
  if (uVar1 == 1) {
    if (local_38 == 'l') {
      local_4 = snprintf(in_RDI,(size_t)in_RSI,in_RDX,in_RCX);
    }
    else {
      *in_RDI = '\0';
      local_4 = -0x19b;
    }
  }
  else {
    *in_RDI = '\0';
    local_4 = -0x19a;
  }
  return local_4;
}

Assistant:

inline int snprintf_s_l(char *dest, rsize_t dmax, const char *format, long a)
{
	char pformatList[MAX_FORMAT_ELEMENTS];
	unsigned int index = 0;

	// Determine the number of format options in the format string
	unsigned int  nfo = parse_format(format, &pformatList[0], MAX_FORMAT_ELEMENTS);

	// Check that there are not too many format options
	if ( nfo != 1 ) {
		dest[0] = '\0';
		return SNPRFNEGATE(ESBADFMT);
	}
	// Check that the format is for an long type
	if ( CHK_FORMAT(FMT_LONG, pformatList[index]) == 0) {
		dest[0] = '\0';
		return SNPRFNEGATE(ESFMTTYP);
	}
	index++;

	return snprintf(dest, dmax, format, a);
}